

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_find_best_sub_pixel_tree_pruned_more
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  byte bVar1;
  int iVar2;
  int iVar3;
  int *cost_list;
  ushort uVar4;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  short sVar11;
  int iVar12;
  scale_factors *psVar13;
  int iVar14;
  MV *pMVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  MV MVar20;
  MV MVar21;
  int16_t iVar22;
  SubpelMvLimits *mv_limits;
  bool bVar23;
  uint local_d8;
  MV left_mv;
  int dummy;
  MV right_mv;
  int local_c8;
  MV top_mv;
  MV local_48;
  MV bottom_mv;
  
  iVar2 = ms_params->allow_hp;
  bVar1 = ms_params->forced_stop;
  iVar3 = ms_params->iters_per_step;
  cost_list = ms_params->cost_list;
  *bestmv = start_mv;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    psVar13 = xd->block_ref_scale_factors[0];
  }
  else {
    psVar13 = &cm->sf_identity;
  }
  mv_cost_params = &ms_params->mv_cost_params;
  var_params = &ms_params->var_params;
  bVar23 = false;
  if ((psVar13->x_scale_fp == -1) || (psVar13->y_scale_fp == -1)) {
LAB_001d795e:
    if ((start_mv_stats == (FULLPEL_MV_STATS *)0x0) || (bVar23)) {
      if (bVar23) goto LAB_001d7993;
      local_d8 = setup_center_error(xd,bestmv,var_params,mv_cost_params,sse1,distortion);
      local_c8 = 0;
    }
    else {
      local_d8 = start_mv_stats->err_cost + start_mv_stats->distortion;
      *distortion = start_mv_stats->distortion;
      *sse1 = start_mv_stats->sse;
      local_c8 = 0;
    }
  }
  else {
    if (psVar13->x_scale_fp == 0x4000) {
      bVar23 = psVar13->y_scale_fp != 0x4000;
      goto LAB_001d795e;
    }
LAB_001d7993:
    local_d8 = upsampled_setup_center_error(xd,cm,bestmv,var_params,mv_cost_params,sse1,distortion);
    local_c8 = 1;
  }
  if (bVar1 == 3) {
    return local_d8;
  }
  if (last_mv_search_list != (int_mv *)0x0) {
    MVar20 = *bestmv;
    if ((MVar20.row == (last_mv_search_list->as_mv).row) &&
       ((int)MVar20 >> 0x10 == (int)(last_mv_search_list->as_mv).col)) {
      return 0x7fffffff;
    }
    (last_mv_search_list->as_mv).row = MVar20.row;
    (last_mv_search_list->as_mv).col = MVar20.col;
  }
  mv_limits = &ms_params->mv_limits;
  sVar18 = start_mv.row;
  sVar19 = start_mv.col;
  if ((((((cost_list == (int *)0x0) || (iVar12 = *cost_list, iVar12 == 0x7fffffff)) ||
        (iVar14 = cost_list[1], iVar14 == 0x7fffffff)) ||
       ((cost_list[2] == 0x7fffffff || (cost_list[3] == 0x7fffffff)))) ||
      ((cost_list[4] <= iVar12 || ((cost_list[3] <= iVar12 || (cost_list[2] <= iVar12)))))) ||
     ((iVar14 <= iVar12 || (cost_list[4] == 0x7fffffff)))) {
    iVar12 = (int)start_mv >> 0x10;
    left_mv.col = sVar19 + -4;
    left_mv.row = sVar18;
    dummy = 0;
    uVar7 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,&dummy,local_c8);
    right_mv.col = sVar19 + 4;
    right_mv.row = sVar18;
    uVar8 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,&dummy,local_c8);
    top_mv.col = sVar19;
    top_mv.row = sVar18 + -4;
    uVar9 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,&dummy,local_c8);
    bottom_mv.row = sVar18 + 4;
    bottom_mv.col = sVar19;
    uVar10 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8
                               ,sse1,distortion,&dummy,local_c8);
    sVar6 = -4;
    if (uVar10 < uVar9) {
      sVar6 = 4;
    }
    sVar11 = -4;
    if (uVar8 < uVar7) {
      sVar11 = 4;
    }
    local_48.row = sVar6 + sVar18;
    local_48.col = sVar11 + sVar19;
    check_better_fast(xd,cm,&local_48,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                      distortion,&dummy,local_c8);
    if (1 < iVar3) {
      sVar19 = bestmv->row;
      sVar16 = bestmv->col;
      iVar14 = (int)sVar16;
      left_mv.row = 0;
      left_mv.col = 0;
      if (iVar12 == iVar14 || sVar18 == sVar19) {
        if (sVar18 == sVar19 && iVar12 != iVar14) {
          right_mv.col = sVar16 + sVar11;
          dummy = CONCAT22(right_mv.col,sVar19 + 4);
          right_mv.row = sVar19 + -4;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          pMVar15 = &top_mv;
          top_mv.col = sVar16;
          top_mv.row = sVar19 - sVar6;
        }
        else {
          if (sVar18 == sVar19 || iVar12 != iVar14) goto LAB_001d7fe7;
          right_mv.row = sVar6 + sVar19;
          dummy = CONCAT22(sVar16 + 4,right_mv.row);
          right_mv.col = sVar16 + -4;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          pMVar15 = &top_mv;
          top_mv.col = sVar16 - sVar11;
          top_mv.row = sVar19;
        }
      }
      else {
        dummy = CONCAT22(sVar16 + sVar11,sVar19);
        right_mv.row = sVar19 + sVar6;
        right_mv.col = sVar16;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,local_c8);
        pMVar15 = &right_mv;
      }
      check_better_fast(xd,cm,pMVar15,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                        distortion,(int *)&left_mv,local_c8);
    }
  }
  else {
    get_cost_surf_min(cost_list,(int *)&left_mv,&dummy,iVar14);
    if (left_mv != (MV)0x0 || dummy != 0) {
      right_mv.row = sVar18 + left_mv.row * 4;
      right_mv.col = sVar19 + (short)dummy * 4;
      top_mv.row = 0;
      top_mv.col = 0;
      check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                        distortion,(int *)&top_mv,local_c8);
    }
  }
LAB_001d7fe7:
  if (1 < bVar1) {
    return local_d8;
  }
  MVar20 = *bestmv;
  sVar19 = MVar20.col;
  if (last_mv_search_list != (int_mv *)0x0) {
    if ((MVar20.row == last_mv_search_list[1].as_mv.row) &&
       ((int)MVar20 >> 0x10 == (int)*(short *)((long)last_mv_search_list + 6))) {
      return 0x7fffffff;
    }
    last_mv_search_list[1].as_mv.row = MVar20.row;
    *(short *)((long)last_mv_search_list + 6) = sVar19;
    MVar20.col = 0;
    MVar20.row = bestmv->row;
    sVar19 = bestmv->col;
  }
  sVar18 = MVar20.row;
  left_mv.col = sVar19 + -2;
  left_mv.row = sVar18;
  dummy = 0;
  uVar7 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                            ,distortion,&dummy,local_c8);
  right_mv.row = sVar18;
  right_mv.col = sVar19 + 2;
  uVar8 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,&dummy,local_c8);
  top_mv.col = sVar19;
  top_mv.row = sVar18 + -2;
  uVar9 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                            distortion,&dummy,local_c8);
  bottom_mv.row = sVar18 + 2;
  bottom_mv.col = sVar19;
  uVar10 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                             sse1,distortion,&dummy,local_c8);
  local_48.row = sVar18 + -2 + (ushort)(uVar10 < uVar9) * 4;
  local_48.col = sVar19 + -2 + (ushort)(uVar8 < uVar7) * 4;
  check_better_fast(xd,cm,&local_48,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                    distortion,&dummy,local_c8);
  if (1 < iVar3) {
    sVar16 = (ushort)(uVar10 < uVar9) * 4 + -2;
    sVar17 = (ushort)(uVar8 < uVar7) * 4 + -2;
    sVar6 = bestmv->row;
    sVar11 = bestmv->col;
    left_mv.row = 0;
    left_mv.col = 0;
    if (sVar19 == sVar11 || sVar18 == sVar6) {
      if (sVar18 == sVar6 && sVar19 != sVar11) {
        right_mv.col = sVar17 + sVar11;
        dummy = CONCAT22(right_mv.col,sVar18 + 2);
        right_mv.row = sVar18 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,local_c8);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,local_c8);
        pMVar15 = &top_mv;
        top_mv.col = sVar11;
        top_mv.row = sVar18 - sVar16;
      }
      else {
        if (sVar18 == sVar6 || sVar19 != sVar11) goto LAB_001d85da;
        right_mv.row = sVar16 + sVar6;
        dummy = CONCAT22(sVar19 + 2,right_mv.row);
        right_mv.col = sVar19 + -2;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,local_c8);
        check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                          distortion,(int *)&left_mv,local_c8);
        pMVar15 = &top_mv;
        top_mv.col = sVar19 - sVar17;
        top_mv.row = sVar6;
      }
    }
    else {
      dummy = CONCAT22(sVar17 + sVar11,sVar6);
      right_mv.row = sVar16 + sVar6;
      right_mv.col = sVar11;
      check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1
                        ,distortion,(int *)&left_mv,local_c8);
      pMVar15 = &right_mv;
    }
    check_better_fast(xd,cm,pMVar15,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                      distortion,(int *)&left_mv,local_c8);
  }
LAB_001d85da:
  if (bVar1 == 0 && iVar2 != 0) {
    MVar21 = *bestmv;
    iVar22 = MVar21.col;
    if (last_mv_search_list != (int_mv *)0x0) {
      if ((MVar21.row == last_mv_search_list[2].as_mv.row) &&
         ((int)MVar21 >> 0x10 == (int)*(short *)((long)last_mv_search_list + 10))) {
        return 0x7fffffff;
      }
      last_mv_search_list[2].as_mv.row = MVar21.row;
      *(int16_t *)((long)last_mv_search_list + 10) = iVar22;
      MVar21.col = 0;
      MVar21.row = bestmv->row;
      iVar22 = bestmv->col;
    }
    sVar19 = MVar21.row;
    left_mv.col = iVar22 + -1;
    left_mv.row = sVar19;
    dummy = 0;
    uVar7 = check_better_fast(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,&dummy,local_c8);
    right_mv.row = sVar19;
    right_mv.col = iVar22 + 1;
    uVar8 = check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,&dummy,local_c8);
    top_mv.col = iVar22;
    top_mv.row = sVar19 + -1;
    uVar9 = check_better_fast(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                              sse1,distortion,&dummy,local_c8);
    bottom_mv.row = sVar19 + 1;
    bottom_mv.col = iVar22;
    uVar10 = check_better_fast(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8
                               ,sse1,distortion,&dummy,local_c8);
    uVar4 = (uVar10 < uVar9) - 1 | 1;
    local_48.row = uVar4 + sVar19;
    uVar5 = (uVar8 < uVar7) - 1 | 1;
    local_48.col = iVar22 + uVar5;
    check_better_fast(xd,cm,&local_48,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                      distortion,&dummy,local_c8);
    if (1 < iVar3) {
      sVar18 = bestmv->row;
      sVar6 = bestmv->col;
      left_mv.row = 0;
      left_mv.col = 0;
      if (iVar22 == sVar6 || sVar19 == sVar18) {
        if (sVar19 == sVar18 && iVar22 != sVar6) {
          right_mv.col = sVar6 + uVar5;
          dummy = CONCAT22(right_mv.col,sVar19 + 1);
          right_mv.row = sVar19 + -1;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          top_mv.col = sVar6;
          top_mv.row = sVar19 - uVar4;
        }
        else {
          if (sVar19 == sVar18 || iVar22 != sVar6) {
            return local_d8;
          }
          right_mv.row = uVar4 + sVar18;
          dummy = CONCAT22(iVar22 + 1,right_mv.row);
          right_mv.col = iVar22 + -1;
          check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          check_better_fast(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                            sse1,distortion,(int *)&left_mv,local_c8);
          top_mv.col = iVar22 - uVar5;
          top_mv.row = sVar18;
        }
        pMVar15 = &top_mv;
      }
      else {
        dummy = CONCAT22(sVar6 + uVar5,sVar18);
        right_mv.row = uVar4 + sVar18;
        right_mv.col = sVar6;
        check_better_fast(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,
                          sse1,distortion,(int *)&left_mv,local_c8);
        pMVar15 = &right_mv;
      }
      check_better_fast(xd,cm,pMVar15,bestmv,mv_limits,var_params,mv_cost_params,&local_d8,sse1,
                        distortion,(int *)&left_mv,local_c8);
    }
  }
  return local_d8;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned_more(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX && is_cost_list_wellbehaved(cost_list)) {
    int ir, ic;
    get_cost_surf_min(cost_list, &ir, &ic, 1);
    if (ir != 0 || ic != 0) {
      const MV this_mv = { start_mv.row + ir * hstep,
                           start_mv.col + ic * hstep };
      int dummy = 0;
      check_better_fast(xd, cm, &this_mv, bestmv, mv_limits, var_params,
                        mv_cost_params, &besterr, sse1, distortion, &dummy,
                        is_scaled);
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}